

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defineCallOpen.hh
# Opt level: O3

shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall>
 __thiscall
discordpp::BotStruct::Call::
shared_from_base<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>::GetChannelCall>
          (Call *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RSI;
  shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall>
  sVar2;
  _func_int **local_20;
  element_type *local_18;
  
  std::__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<discordpp::BotStruct::Call,void>
            ((__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (__weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  this->_vptr_Call = local_20;
  (this->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
  super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  _Var1._M_pi = extraout_RDX;
  if (local_18 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_18->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
               super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_18->super_enable_shared_from_this<discordpp::BotStruct::Call>).
                    _M_weak_this.
                    super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + 1;
      UNLOCK();
      if (local_18 == (element_type *)0x0) goto LAB_001807fc;
    }
    else {
      *(int *)&(local_18->super_enable_shared_from_this<discordpp::BotStruct::Call>)._M_weak_this.
               super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_18->super_enable_shared_from_this<discordpp::BotStruct::Call>).
                    _M_weak_this.
                    super___weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
LAB_001807fc:
  sVar2.
  super___shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall>
          )sVar2.
           super___shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Derived> shared_from_base() {
        return std::static_pointer_cast<Derived>(shared_from_this());
    }